

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

char * make_filename(int index,char *subname)

{
  __uid_t __uid;
  int iVar1;
  char *pcVar2;
  passwd *ppVar3;
  char *pcVar4;
  passwd *__name;
  strbuf *psVar5;
  passwd *local_90;
  passwd *local_88;
  strbuf *sb_1;
  strbuf *sb;
  char *pwd_home;
  char *home;
  char *old_dir3;
  char *old_dir2;
  char *old_dir;
  char *xdg_dir;
  passwd *pwd;
  char *ret;
  char *tmp;
  char *env;
  char *subname_local;
  passwd *ppStack_10;
  int index_local;
  
  if (index == 0) {
    pcVar2 = getenv("PUTTYDIR");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = getenv("HOME");
      __uid = getuid();
      ppVar3 = getpwuid(__uid);
      if ((ppVar3 == (passwd *)0x0) || (ppVar3->pw_dir == (char *)0x0)) {
        sb = (strbuf *)0x0;
      }
      else {
        sb = (strbuf *)ppVar3->pw_dir;
      }
      old_dir = (char *)0x0;
      pcVar4 = getenv("XDG_CONFIG_HOME");
      if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
        old_dir = dupprintf("%s/putty");
      }
      if (old_dir == (char *)0x0) {
        old_dir = dupprintf("%s/.config/putty");
      }
      if ((old_dir == (char *)0x0) || (iVar1 = access(old_dir,0), iVar1 != 0)) {
        old_dir3 = (char *)0x0;
        old_dir2 = (char *)0x0;
        if (pcVar2 != (char *)0x0) {
          old_dir2 = dupprintf("%s/.putty");
        }
        if (sb != (strbuf *)0x0) {
          old_dir3 = dupprintf("%s/.putty");
        }
        __name = (passwd *)dupstr("/.putty");
        if ((old_dir2 == (char *)0x0) || (iVar1 = access(old_dir2,0), iVar1 != 0)) {
          if ((old_dir3 == (char *)0x0) || (iVar1 = access(old_dir3,0), iVar1 != 0)) {
            iVar1 = access((char *)__name,0);
            pwd = __name;
            if (iVar1 != 0) {
              if (old_dir2 == (char *)0x0) {
                local_90 = __name;
                if (old_dir3 != (char *)0x0) {
                  local_90 = (passwd *)old_dir3;
                }
                local_88 = local_90;
              }
              else {
                local_88 = (passwd *)old_dir2;
              }
              pwd = local_88;
            }
          }
          else {
            pwd = (passwd *)old_dir3;
          }
        }
        else {
          pwd = (passwd *)old_dir2;
        }
        if (pwd != (passwd *)old_dir2) {
          safefree(old_dir2);
        }
        if (pwd != (passwd *)old_dir3) {
          safefree(old_dir3);
        }
        if (pwd != __name) {
          safefree(__name);
        }
        if (pwd != (passwd *)old_dir) {
          safefree(old_dir);
        }
        ppStack_10 = pwd;
      }
      else {
        ppStack_10 = (passwd *)old_dir;
      }
    }
    else {
      ppStack_10 = (passwd *)dupstr(pcVar2);
    }
  }
  else if (index == 4) {
    pcVar2 = getenv("PUTTYSESSIONS");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = make_filename(0,(char *)0x0);
      ppStack_10 = (passwd *)dupprintf("%s/sessions",pcVar2);
      safefree(pcVar2);
    }
    else {
      ppStack_10 = (passwd *)dupstr(pcVar2);
    }
  }
  else if (index == 5) {
    psVar5 = strbuf_new();
    pcVar2 = make_filename(4,(char *)0x0);
    BinarySink_put_fmt(psVar5->binarysink_,"%s/",pcVar2);
    safefree(pcVar2);
    make_session_filename(subname,psVar5);
    ppStack_10 = (passwd *)strbuf_to_str(psVar5);
  }
  else if (index == 1) {
    pcVar2 = getenv("PUTTYSSHHOSTKEYS");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = make_filename(0,(char *)0x0);
      ppStack_10 = (passwd *)dupprintf("%s/sshhostkeys",pcVar2);
      safefree(pcVar2);
    }
    else {
      ppStack_10 = (passwd *)dupstr(pcVar2);
    }
  }
  else if (index == 2) {
    pcVar2 = make_filename(1,(char *)0x0);
    ppStack_10 = (passwd *)dupprintf("%s.tmp",pcVar2);
    safefree(pcVar2);
  }
  else if (index == 3) {
    pcVar2 = getenv("PUTTYRANDOMSEED");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = make_filename(0,(char *)0x0);
      ppStack_10 = (passwd *)dupprintf("%s/randomseed",pcVar2);
      safefree(pcVar2);
    }
    else {
      ppStack_10 = (passwd *)dupstr(pcVar2);
    }
  }
  else if (index == 6) {
    pcVar2 = getenv("PUTTYSSHHOSTCAS");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = make_filename(0,(char *)0x0);
      ppStack_10 = (passwd *)dupprintf("%s/sshhostcas",pcVar2);
      safefree(pcVar2);
    }
    else {
      ppStack_10 = (passwd *)dupstr(pcVar2);
    }
  }
  else if (index == 7) {
    psVar5 = strbuf_new();
    pcVar2 = make_filename(6,(char *)0x0);
    BinarySink_put_fmt(psVar5->binarysink_,"%s/",pcVar2);
    safefree(pcVar2);
    make_session_filename(subname,psVar5);
    ppStack_10 = (passwd *)strbuf_to_str(psVar5);
  }
  else {
    pcVar2 = make_filename(0,(char *)0x0);
    ppStack_10 = (passwd *)dupprintf("%s/ERROR",pcVar2);
    safefree(pcVar2);
  }
  return (char *)ppStack_10;
}

Assistant:

static char *make_filename(int index, const char *subname)
{
    char *env, *tmp, *ret;

    /*
     * Allow override of the PuTTY configuration location, and of
     * specific subparts of it, by means of environment variables.
     */
    if (index == INDEX_DIR) {
        struct passwd *pwd;
        char *xdg_dir, *old_dir, *old_dir2, *old_dir3, *home, *pwd_home;

        env = getenv("PUTTYDIR");
        if (env)
            return dupstr(env);

        home = getenv("HOME");
        pwd = getpwuid(getuid());
        if (pwd && pwd->pw_dir) {
            pwd_home = pwd->pw_dir;
        } else {
            pwd_home = NULL;
        }

        xdg_dir = NULL;
        env = getenv("XDG_CONFIG_HOME");
        if (env && *env) {
            xdg_dir = dupprintf("%s/putty", env);
        }
        if (!xdg_dir) {
            if (home) {
                tmp = home;
            } else if (pwd_home) {
                tmp = pwd_home;
            } else {
                tmp = "";
            }
            xdg_dir = dupprintf("%s/.config/putty", tmp);
        }
        if (xdg_dir && access(xdg_dir, F_OK) == 0) {
            return xdg_dir;
        }

        old_dir = old_dir2 = old_dir3 = NULL;
        if (home) {
            old_dir = dupprintf("%s/.putty", home);
        }
        if (pwd_home) {
            old_dir2 = dupprintf("%s/.putty", pwd_home);
        }
        old_dir3 = dupstr("/.putty");

        if (old_dir && access(old_dir, F_OK) == 0) {
            ret = old_dir;
            goto out;
        }
        if (old_dir2 && access(old_dir2, F_OK) == 0) {
            ret = old_dir2;
            goto out;
        }
        if (access(old_dir3, F_OK) == 0) {
            ret = old_dir3;
            goto out;
        }
#ifdef XDG_DEFAULT
        if (xdg_dir) {
            ret = xdg_dir;
            goto out;
        }
#endif
        ret = old_dir ? old_dir : (old_dir2 ? old_dir2 : old_dir3);

      out:
        if (ret != old_dir)
            sfree(old_dir);
        if (ret != old_dir2)
            sfree(old_dir2);
        if (ret != old_dir3)
            sfree(old_dir3);
        if (ret != xdg_dir)
            sfree(xdg_dir);
        return ret;
    }
    if (index == INDEX_SESSIONDIR) {
        env = getenv("PUTTYSESSIONS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sessions", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_SESSION) {
        strbuf *sb = strbuf_new();
        tmp = make_filename(INDEX_SESSIONDIR, NULL);
        put_fmt(sb, "%s/", tmp);
        sfree(tmp);
        make_session_filename(subname, sb);
        return strbuf_to_str(sb);
    }
    if (index == INDEX_HOSTKEYS) {
        env = getenv("PUTTYSSHHOSTKEYS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sshhostkeys", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTKEYS_TMP) {
        tmp = make_filename(INDEX_HOSTKEYS, NULL);
        ret = dupprintf("%s.tmp", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_RANDSEED) {
        env = getenv("PUTTYRANDOMSEED");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/randomseed", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTCADIR) {
        env = getenv("PUTTYSSHHOSTCAS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sshhostcas", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTCA) {
        strbuf *sb = strbuf_new();
        tmp = make_filename(INDEX_HOSTCADIR, NULL);
        put_fmt(sb, "%s/", tmp);
        sfree(tmp);
        make_session_filename(subname, sb);
        return strbuf_to_str(sb);
    }
    tmp = make_filename(INDEX_DIR, NULL);
    ret = dupprintf("%s/ERROR", tmp);
    sfree(tmp);
    return ret;
}